

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  undefined7 in_register_00000031;
  ImGuiContext *ctx;
  int iVar8;
  
  pIVar4 = GImGui;
  uVar3 = GImGui->CurrentItemFlags | option;
  if ((int)CONCAT71(in_register_00000031,enabled) == 0) {
    uVar3 = ~option & GImGui->CurrentItemFlags;
  }
  iVar5 = (GImGui->ItemFlagsStack).Size;
  GImGui->CurrentItemFlags = uVar3;
  if (iVar5 == (pIVar4->ItemFlagsStack).Capacity) {
    if (iVar5 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar5 / 2 + iVar5;
    }
    iVar8 = iVar5 + 1;
    if (iVar5 + 1 < iVar7) {
      iVar8 = iVar7;
    }
    piVar6 = &(pIVar4->IO).MetricsActiveAllocations;
    *piVar6 = *piVar6 + 1;
    piVar6 = (int *)(*GImAllocatorAllocFunc)((long)iVar8 << 2,GImAllocatorUserData);
    piVar2 = (pIVar4->ItemFlagsStack).Data;
    if (piVar2 != (int *)0x0) {
      memcpy(piVar6,piVar2,(long)(pIVar4->ItemFlagsStack).Size << 2);
      piVar2 = (pIVar4->ItemFlagsStack).Data;
      if ((piVar2 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar2,GImAllocatorUserData);
    }
    (pIVar4->ItemFlagsStack).Data = piVar6;
    (pIVar4->ItemFlagsStack).Capacity = iVar8;
    iVar5 = (pIVar4->ItemFlagsStack).Size;
  }
  else {
    piVar6 = (pIVar4->ItemFlagsStack).Data;
  }
  piVar6[iVar5] = uVar3;
  (pIVar4->ItemFlagsStack).Size = (pIVar4->ItemFlagsStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiItemFlags item_flags = g.CurrentItemFlags;
    IM_ASSERT(item_flags == g.ItemFlagsStack.back());
    if (enabled)
        item_flags |= option;
    else
        item_flags &= ~option;
    g.CurrentItemFlags = item_flags;
    g.ItemFlagsStack.push_back(item_flags);
}